

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

void __thiscall cfd::TransactionContext::TransactionContext(TransactionContext *this,string *tx_hex)

{
  _Rb_tree_header *p_Var1;
  pointer pUVar2;
  pointer pUVar3;
  pointer this_00;
  
  core::Transaction::Transaction(&this->super_Transaction,tx_hex);
  (this->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&PTR__TransactionContext_00740e38;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->signed_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar2 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = pUVar2;
  if (pUVar3 != pUVar2) {
    do {
      UtxoData::~UtxoData(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pUVar3);
    (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar2;
  }
  std::
  _Rb_tree<cfd::core::OutPoint,_std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>,_std::_Select1st<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::clear(&(this->signed_map_)._M_t);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::clear(&this->verify_map_);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::clear
            (&this->verify_ignore_map_);
  return;
}

Assistant:

TransactionContext::TransactionContext(const std::string& tx_hex)
    : Transaction(tx_hex) {
  utxo_map_.clear();
  signed_map_.clear();
  verify_map_.clear();
  verify_ignore_map_.clear();
}